

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshotDiff.cpp
# Opt level: O1

bool __thiscall efsw::DirectorySnapshotDiff::changed(DirectorySnapshotDiff *this)

{
  return (_List_node_base *)&this->DirsDeleted !=
         (this->DirsDeleted).super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
         _M_impl._M_node.super__List_node_base._M_next ||
         (((_List_node_base *)&this->DirsMoved !=
           (this->DirsMoved).
           super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
           ._M_impl._M_node.super__List_node_base._M_next ||
          ((_List_node_base *)&this->DirsModified !=
           (this->DirsModified).super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
           _M_impl._M_node.super__List_node_base._M_next ||
          (_List_node_base *)&this->DirsCreated !=
          (this->DirsCreated).super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
          _M_impl._M_node.super__List_node_base._M_next)) ||
         (((DirectorySnapshotDiff *)
           (this->FilesDeleted).super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
           _M_impl._M_node.super__List_node_base._M_next != this ||
          (_List_node_base *)&this->FilesMoved !=
          (this->FilesMoved).
          super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
          ._M_impl._M_node.super__List_node_base._M_next) ||
         ((_List_node_base *)&this->FilesModified !=
          (this->FilesModified).super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
          _M_impl._M_node.super__List_node_base._M_next ||
         (_List_node_base *)&this->FilesCreated !=
         (this->FilesCreated).super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
         _M_impl._M_node.super__List_node_base._M_next)));
}

Assistant:

bool DirectorySnapshotDiff::changed()
{
	return	!FilesCreated.empty()	||
			!FilesModified.empty()	||
			!FilesMoved.empty()		||
			!FilesDeleted.empty()	||
			!DirsCreated.empty()	||
			!DirsModified.empty()	||
			!DirsMoved.empty()		||
			!DirsDeleted.empty();
}